

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O3

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::changeCol(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,int n,
           LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *newCol,bool scale)

{
  int *piVar1;
  Item *pIVar2;
  int iVar3;
  int iVar4;
  Item *pIVar5;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar6;
  bool bVar7;
  int iVar8;
  byte bVar9;
  LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pLVar10;
  int *piVar11;
  undefined7 in_register_00000009;
  char *pcVar12;
  long lVar13;
  ulong uVar14;
  char *__filename;
  LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pLVar15;
  uint *puVar16;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar17;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  *pnVar18;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar19;
  soplex *psVar20;
  long lVar21;
  byte bVar22;
  int idx;
  int local_1cc;
  undefined4 local_1c8;
  int local_1c4;
  LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_1c0;
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_1b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  soplex local_130 [112];
  int local_c0;
  undefined1 local_bc;
  int local_b8;
  int local_b4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  local_b0;
  
  bVar22 = 0;
  local_1c8 = (undefined4)CONCAT71(in_register_00000009,scale);
  if (-1 < n) {
    pIVar2 = (this->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.theitem +
             (this->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thekey[(uint)n].idx;
    lVar21 = (long)(pIVar2->data).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .memused;
    local_1cc = n;
    local_1c0 = newCol;
    if (0 < lVar21) {
      do {
        pIVar5 = (this->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.theitem;
        iVar3 = (this->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thekey
                [(pIVar2->data).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .m_elem[lVar21 + -1].idx].idx;
        pNVar6 = pIVar5[iVar3].data.
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .m_elem;
        if (pNVar6 != (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x0) {
          pIVar5 = pIVar5 + iVar3;
          pcVar12 = (char *)(long)(pIVar5->data).
                                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  .memused;
          if (0 < (long)pcVar12) {
            piVar11 = &pNVar6->idx;
            __filename = (char *)0x0;
            do {
              if (*piVar11 == n) {
                SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::remove((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)pIVar5,__filename);
                break;
              }
              __filename = __filename + 1;
              piVar11 = piVar11 + 0x21;
            } while (pcVar12 != __filename);
          }
        }
        bVar7 = 1 < lVar21;
        lVar21 = lVar21 + -1;
      } while (bVar7);
    }
    pLVar10 = local_1c0;
    (pIVar2->data).
    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .memused = 0;
    pLVar15 = local_1c0;
    pnVar17 = &local_1b0;
    for (lVar21 = 0x1c; lVar21 != 0; lVar21 = lVar21 + -1) {
      (pnVar17->m_backend).data._M_elems[0] = (pLVar15->up).m_backend.data._M_elems[0];
      pLVar15 = (LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)((long)pLVar15 + (ulong)bVar22 * -8 + 4);
      pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar17 + ((ulong)bVar22 * -2 + 1) * 4);
    }
    local_1b0.m_backend.exp = (local_1c0->up).m_backend.exp;
    local_1b0.m_backend.neg = (local_1c0->up).m_backend.neg;
    local_1b0.m_backend.fpclass = (local_1c0->up).m_backend.fpclass;
    local_1b0.m_backend.prec_elem = (local_1c0->up).m_backend.prec_elem;
    bVar9 = (byte)local_1c8;
    uVar14 = (ulong)(byte)local_1c8;
    (*(this->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x2d])(this,(ulong)(uint)n,&local_1b0,uVar14);
    pnVar17 = &pLVar10->low;
    pnVar19 = &local_1b0;
    for (lVar21 = 0x1c; lVar21 != 0; lVar21 = lVar21 + -1) {
      (pnVar19->m_backend).data._M_elems[0] = (pnVar17->m_backend).data._M_elems[0];
      pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar17 + (ulong)bVar22 * -8 + 4);
      pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar19 + ((ulong)bVar22 * -2 + 1) * 4);
    }
    local_1b0.m_backend.exp = (pLVar10->low).m_backend.exp;
    local_1b0.m_backend.neg = (pLVar10->low).m_backend.neg;
    local_1b0.m_backend.fpclass = (pLVar10->low).m_backend.fpclass;
    local_1b0.m_backend.prec_elem = (pLVar10->low).m_backend.prec_elem;
    (*(this->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x2a])(this,(ulong)(uint)n,&local_1b0,(ulong)bVar9);
    pnVar17 = &pLVar10->object;
    pnVar19 = &local_1b0;
    for (lVar21 = 0x1c; lVar21 != 0; lVar21 = lVar21 + -1) {
      (pnVar19->m_backend).data._M_elems[0] = (pnVar17->m_backend).data._M_elems[0];
      pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar17 + (ulong)bVar22 * -8 + 4);
      pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar19 + ((ulong)bVar22 * -2 + 1) * 4);
    }
    local_1b0.m_backend.exp = (pLVar10->object).m_backend.exp;
    local_1b0.m_backend.neg = (pLVar10->object).m_backend.neg;
    local_1b0.m_backend.fpclass = (pLVar10->object).m_backend.fpclass;
    local_1b0.m_backend.prec_elem = (pLVar10->object).m_backend.prec_elem;
    (*(this->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x24])(this,(ulong)(uint)n,&local_1b0,uVar14);
    lVar21 = (long)(pLVar10->vec).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .memused;
    if (0 < lVar21) {
      local_1b8 = &this->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ;
      uVar14 = lVar21 + 1;
      lVar21 = lVar21 * 0x84 + -4;
      do {
        piVar11 = (int *)((long)(((local_1c0->vec).
                                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 .m_elem)->val).m_backend.data._M_elems + lVar21);
        local_1c4 = *piVar11;
        puVar16 = (uint *)(piVar11 + -0x20);
        pnVar17 = &local_1b0;
        for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
          (pnVar17->m_backend).data._M_elems[0] = *puVar16;
          puVar16 = puVar16 + (ulong)bVar22 * -2 + 1;
          pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar17 + ((ulong)bVar22 * -2 + 1) * 4);
        }
        local_1b0.m_backend.exp = piVar11[-4];
        iVar8 = piVar11[-3];
        local_1b0.m_backend.neg = (bool)(char)iVar8;
        piVar1 = piVar11 + -2;
        iVar3 = *piVar1;
        iVar4 = piVar11[-1];
        local_1b0.m_backend.fpclass = piVar1[0];
        local_1b0.m_backend.prec_elem = piVar1[1];
        if ((byte)local_1c8 != '\0') {
          pnVar17 = &local_1b0;
          psVar20 = local_130;
          for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
            *(uint *)psVar20 = (pnVar17->m_backend).data._M_elems[0];
            pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar17 + ((ulong)bVar22 * -2 + 1) * 4);
            psVar20 = psVar20 + ((ulong)bVar22 * -2 + 1) * 4;
          }
          piVar11 = (this->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).scaleExp.data;
          local_c0 = local_1b0.m_backend.exp;
          local_bc = (char)iVar8;
          local_b8 = iVar3;
          local_b4 = iVar4;
          spxLdexp<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                    (&local_b0,local_130,
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)(ulong)(uint)((this->
                                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ).scaleExp.data[local_1c4] + piVar11[local_1cc]),(int)piVar11)
          ;
          pnVar18 = &local_b0;
          pnVar17 = &local_1b0;
          for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
            (pnVar17->m_backend).data._M_elems[0] = (pnVar18->m_backend).data._M_elems[0];
            pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                       *)((long)pnVar18 + ((ulong)bVar22 * -2 + 1) * 4);
            pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar17 + ((ulong)bVar22 * -2 + 1) * 4);
          }
          local_1b0.m_backend.exp = local_b0.m_backend.exp;
          local_1b0.m_backend.neg = local_b0.m_backend.neg;
          local_1b0.m_backend.fpclass = local_b0.m_backend.fpclass;
          local_1b0.m_backend.prec_elem = local_b0.m_backend.prec_elem;
        }
        LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::add2(local_1b8,local_1cc,1,&local_1c4,&local_1b0);
        LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::add2(&this->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ,local_1c4,1,&local_1cc,&local_1b0);
        uVar14 = uVar14 - 1;
        lVar21 = lVar21 + -0x84;
      } while (1 < uVar14);
    }
  }
  return;
}

Assistant:

virtual void changeCol(int n, const LPColBase<R>& newCol, bool scale = false)
   {
      if(n < 0)
         return;

      int j;
      SVectorBase<R>& col = colVector_w(n);

      for(j = col.size() - 1; j >= 0; --j)
      {
         SVectorBase<R>& row = rowVector_w(col.index(j));
         int position = row.pos(n);

         assert(position != -1);

         if(position >= 0)
            row.remove(position);
      }

      col.clear();

      changeUpper(n, newCol.upper(), scale);
      changeLower(n, newCol.lower(), scale);
      changeObj(n, newCol.obj(), scale);

      const SVectorBase<R>& newcol = newCol.colVector();

      for(j = newcol.size() - 1; j >= 0; --j)
      {
         int idx = newcol.index(j);
         R val = newcol.value(j);

         if(scale)
            val = spxLdexp(val, LPColSetBase<R>::scaleExp[n] + LPRowSetBase<R>::scaleExp[idx]);

         LPColSetBase<R>::add2(n, 1, &idx, &val);
         LPRowSetBase<R>::add2(idx, 1, &n, &val);
      }

      assert(isConsistent());
   }